

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

float FromLinearHlg(float linear)

{
  float fVar1;
  undefined4 local_4;
  
  fVar1 = Powf(0.0,2.423159e-39);
  if (0.0 <= fVar1) {
    if (0.083333336 < fVar1) {
      fVar1 = logf(fVar1 * 12.0 + -0.28466892);
      local_4 = fVar1 * 0.17883277 + 0.5599107;
    }
    else {
      local_4 = sqrtf(fVar1 * 3.0);
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static float FromLinearHlg(float linear) {
  linear = Powf(linear, 1.f / 1.2f);
  if (linear < 0.f) {
    return 0.f;
  } else if (linear <= (1.f / 12.f)) {
    return sqrtf(3.f * linear);
  }
  return 0.17883277f * logf(12.f * linear - 0.28466892f) + 0.55991073f;
}